

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemorefine.cc
# Opt level: O0

void lecturedemo::lecturedemorefine(void)

{
  ostream *poVar1;
  undefined1 local_18 [8];
  shared_ptr<lf::mesh::Mesh> mesh_p;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"LehrFEM++ refinement demos");
  std::operator<<(poVar1,'\n');
  lf::mesh::test_utils::GenerateHybrid2DTestMesh((test_utils *)local_18,0,1.0);
  regrefMeshSequence((shared_ptr<lf::mesh::Mesh> *)local_18,5);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)local_18);
  return;
}

Assistant:

void lecturedemorefine() {
  std::cout << "LehrFEM++ refinement demos" << '\n';
  // Obtain hybrid test mesh
  const std::shared_ptr<lf::mesh::Mesh> mesh_p =
      lf::mesh::test_utils::GenerateHybrid2DTestMesh(0);
  // Request regular refinement, 5 levels
  regrefMeshSequence(mesh_p, 5);
}